

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O1

size_t __thiscall helics::Input::getVectorSize(Input *this)

{
  __index_type _Var1;
  variant_alternative_t<4UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar2;
  sbyte sVar3;
  
  if (this->hasUpdate == false) {
    checkUpdate(this,false);
  }
  if (((this->hasUpdate == true) && (this->changeDetectionEnabled == false)) &&
     (this->inputVectorOp == NO_OP)) {
LAB_0029bf9d:
    pvVar2 = (variant_alternative_t<4UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
              *)getValueRef<std::vector<double,std::allocator<double>>>(this);
  }
  else {
    _Var1 = *(__index_type *)
             ((long)&(this->lastValue).
                     super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                     .
                     super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                     .
                     super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                     .
                     super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                     .
                     super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                     .
                     super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
             + 0x28);
    if (_Var1 == '\x05') {
      pvVar2 = (variant_alternative_t<4UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
                *)std::
                  get<5ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                            (&this->lastValue);
      sVar3 = 4;
      goto LAB_0029bfb6;
    }
    if (_Var1 != '\x04') goto LAB_0029bf9d;
    pvVar2 = std::
             get<4ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (&this->lastValue);
  }
  sVar3 = 3;
LAB_0029bfb6:
  return (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start >> sVar3;
}

Assistant:

size_t Input::getVectorSize()
{
    isUpdated();
    if (allowDirectFederateUpdate()) {
        const auto& out = getValueRef<std::vector<double>>();
        return out.size();
    }
    switch (lastValue.index()) {
        case vector_loc:
            return std::get<std::vector<double>>(lastValue).size();
        case complex_vector_loc:
            return std::get<std::vector<std::complex<double>>>(lastValue).size();
        default:
            break;
    }
    const auto& out = getValueRef<std::vector<double>>();
    return out.size();
}